

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImNodes.cpp
# Opt level: O0

bool ImNodes::IsConnectingCompatibleSlot(void)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ImGuiPayload *pIVar5;
  _IgnoreSlot *p_Var6;
  _IgnoreSlot *ignored;
  char local_58 [4];
  int i;
  char drag_id [32];
  _DragConnectionPayload *drag_payload;
  ImGuiPayload *payload;
  _CanvasStateImpl *impl;
  CanvasState *canvas;
  
  if (gCanvas == 0) {
    __assert_fail("gCanvas != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,0x32f,"bool ImNodes::IsConnectingCompatibleSlot()");
  }
  lVar1 = *(long *)(gCanvas + 0x98);
  pIVar5 = ImGui::GetDragDropPayload();
  if (pIVar5 == (ImGuiPayload *)0x0) {
    canvas._7_1_ = false;
  }
  else if (*pIVar5->Data == *(long *)(lVar1 + 0x10)) {
    canvas._7_1_ = false;
  }
  else {
    snprintf(local_58,0x20,"new-node-connection-%08X",(ulong)(uint)-*(int *)(lVar1 + 0x28));
    iVar4 = strcmp(local_58,pIVar5->DataType);
    if (iVar4 == 0) {
      for (ignored._4_4_ = 0;
          iVar4 = ImVector<ImNodes::_IgnoreSlot>::size
                            ((ImVector<ImNodes::_IgnoreSlot> *)(lVar1 + 0x98)),
          ignored._4_4_ < iVar4; ignored._4_4_ = ignored._4_4_ + 1) {
        p_Var6 = ImVector<ImNodes::_IgnoreSlot>::operator[]
                           ((ImVector<ImNodes::_IgnoreSlot> *)(lVar1 + 0x98),ignored._4_4_);
        if ((p_Var6->node_id == *(void **)(lVar1 + 0x10)) &&
           (iVar4 = strcmp(p_Var6->slot_name,p_Var6->slot_name), iVar4 == 0)) {
          bVar2 = IsInputSlotKind(p_Var6->slot_kind);
          bVar3 = IsInputSlotKind(*(int *)(lVar1 + 0x28));
          if (bVar2 == bVar3) {
            return false;
          }
        }
      }
      canvas._7_1_ = true;
    }
    else {
      canvas._7_1_ = false;
    }
  }
  return canvas._7_1_;
}

Assistant:

bool IsConnectingCompatibleSlot()
{
    assert(gCanvas != nullptr);
    auto* canvas = gCanvas;
    auto* impl = canvas->_impl;

    if (auto* payload = ImGui::GetDragDropPayload())
    {
        auto* drag_payload = (_DragConnectionPayload*)payload->Data;

        if (drag_payload->node_id == impl->node.id)
            // Node can not connect to itself
            return false;

        char drag_id[32];
        snprintf(drag_id, sizeof(drag_id), "new-node-connection-%08X", impl->slot.kind * -1);
        if (strcmp(drag_id, payload->DataType) != 0)
            return false;

        for (int i = 0; i < impl->ignore_connections.size(); i++)
        {
            const _IgnoreSlot& ignored = impl->ignore_connections[i];
            if (ignored.node_id == impl->node.id && strcmp(ignored.slot_name, ignored.slot_name) == 0 &&
                IsInputSlotKind(ignored.slot_kind) == IsInputSlotKind(impl->slot.kind))
                return false;
        }

        return true;
    }

    return false;
}